

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  byte bVar1;
  uint ttf_size;
  uint uVar2;
  uchar *ttf_data;
  ImFont *pIVar3;
  ulong uVar4;
  uint uVar5;
  ushort *puVar6;
  ushort *puVar7;
  long lStack_d0;
  ImFontConfig local_b8;
  
  ttf_size = stb_decompress_length((uchar *)compressed_ttf_data);
  ttf_data = (uchar *)ImGui::MemAlloc((ulong)ttf_size);
  uVar2 = *compressed_ttf_data;
  if (((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
       0x57bc0000) &&
     (uVar2 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar2 >> 0x18 == 0 && (uVar2 & 0xff0000) == 0) && (uVar2 & 0xff00) == 0) &&
     (uVar2 & 0xff) == 0)) {
    uVar2 = stb_decompress_length((uchar *)compressed_ttf_data);
    puVar6 = (ushort *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e = ttf_data + uVar2;
    stb__barrier_out_b = ttf_data;
    stb__dout = ttf_data;
    do {
      bVar1 = (byte)*puVar6;
      uVar5 = (uint)bVar1;
      if (bVar1 < 0x20) {
        if (bVar1 < 0x18) {
          if (bVar1 < 0x10) {
            if (bVar1 < 8) {
              if (bVar1 == 4) {
                stb__match(stb__dout +
                           ~((ulong)*(byte *)((long)puVar6 + 3) |
                             (ulong)*(byte *)((long)puVar6 + 1) << 0x10 |
                            (ulong)(byte)puVar6[1] << 8),
                           (ushort)(puVar6[2] << 8 | puVar6[2] >> 8) + 1);
                puVar7 = puVar6 + 3;
                goto LAB_001de205;
              }
              if (uVar5 == 6) {
                uVar4 = ~((ulong)*(byte *)((long)puVar6 + 3) |
                          (ulong)*(byte *)((long)puVar6 + 1) << 0x10 | (ulong)(byte)puVar6[1] << 8);
                uVar5 = (uint)(byte)puVar6[2];
                goto LAB_001de182;
              }
              if (uVar5 != 7) break;
              stb__lit((byte *)((long)puVar6 + 3),
                       (ushort)(*(ushort *)((long)puVar6 + 1) << 8 |
                               *(ushort *)((long)puVar6 + 1) >> 8) + 1);
              uVar4 = (ulong)(ushort)(*(ushort *)((long)puVar6 + 1) << 8 |
                                     *(ushort *)((long)puVar6 + 1) >> 8);
              lStack_d0 = 4;
            }
            else {
              stb__lit((uchar *)(puVar6 + 1),
                       ((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar6 + 1)) - 0x7ff);
              uVar4 = (ulong)(ushort)(*puVar6 << 8 | *puVar6 >> 8);
              lStack_d0 = -0x7fd;
            }
LAB_001de1f3:
            puVar7 = (ushort *)((long)puVar6 + uVar4 + lStack_d0);
            if (puVar7 == puVar6) break;
          }
          else {
            uVar4 = -(ulong)(((uint)*(byte *)((long)puVar6 + 1) * 0x100 +
                             ((uint)(byte)puVar6[1] | (uint)bVar1 << 0x10)) - 0xfffff);
            uVar5 = (uint)(ushort)(*(ushort *)((long)puVar6 + 3) << 8 |
                                  *(ushort *)((long)puVar6 + 3) >> 8);
LAB_001de182:
            stb__match(stb__dout + uVar4,uVar5 + 1);
            puVar7 = (ushort *)((long)puVar6 + 5);
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)(((uint)*(byte *)((long)puVar6 + 1) * 0x100 +
                              ((uint)(byte)puVar6[1] | (uint)bVar1 << 0x10)) - 0x17ffff),
                     *(byte *)((long)puVar6 + 3) + 1);
          puVar7 = puVar6 + 2;
        }
      }
      else if ((char)bVar1 < '\0') {
        stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar6 + 1),uVar5 - 0x7f);
        puVar7 = puVar6 + 1;
      }
      else {
        if (bVar1 < 0x40) {
          stb__lit((byte *)((long)puVar6 + 1),uVar5 - 0x1f);
          uVar4 = (ulong)(byte)*puVar6;
          lStack_d0 = -0x1e;
          goto LAB_001de1f3;
        }
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar6 + 1) + (uint)bVar1 * 0x100) - 0x3fff),
                   (byte)puVar6[1] + 1);
        puVar7 = (ushort *)((long)puVar6 + 3);
      }
LAB_001de205:
      puVar6 = puVar7;
    } while (stb__dout <= ttf_data + uVar2);
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    memset(&local_b8,0,0x88);
    local_b8.OversampleH = 3;
    local_b8.OversampleV = 1;
    local_b8.GlyphMaxAdvanceX = 3.4028235e+38;
    local_b8.RasterizerMultiply = 1.0;
    local_b8.EllipsisChar = 0xffff;
  }
  else {
    memcpy(&local_b8,font_cfg_template,0x88);
  }
  local_b8.FontDataOwnedByAtlas = true;
  pIVar3 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_b8,glyph_ranges);
  return pIVar3;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}